

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_file_writer_flush(mpack_writer_t *writer,char *buffer,size_t count)

{
  size_t sVar1;
  
  sVar1 = fwrite(buffer,1,count,(FILE *)writer->context);
  if ((sVar1 != count) && (writer->error == mpack_ok)) {
    writer->error = mpack_error_io;
    if (writer->error_fn != (mpack_writer_error_t)0x0) {
      (*writer->error_fn)(writer,mpack_error_io);
      return;
    }
  }
  return;
}

Assistant:

static void mpack_file_writer_flush(mpack_writer_t* writer, const char* buffer, size_t count) {
    FILE* file = (FILE*)writer->context;
    size_t written = fwrite((const void*)buffer, 1, count, file);
    if (written != count)
        mpack_writer_flag_error(writer, mpack_error_io);
}